

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O3

void __thiscall
TPZFileEqnStorage<double>::Print(TPZFileEqnStorage<double> *this,char *name,ostream *out)

{
  long __off;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  TPZEqnArray<double> REqnArray;
  TPZEqnArray<double> TStack_32b8;
  
  TPZEqnArray<double>::TPZEqnArray(&TStack_32b8);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of entries on File  ",0x1b);
  poVar1 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  lVar2 = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      __off = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar3];
      if (__off != 0) {
        fseek((FILE *)this->fIOStream,__off,0);
        TPZEqnArray<double>::Read(&TStack_32b8,this->fIOStream);
        TPZEqnArray<double>::Print(&TStack_32b8,name,out);
        lVar2 = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  TPZEqnArray<double>::~TPZEqnArray(&TStack_32b8);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Print(const char *name, std::ostream& out) const {
    int i;
	TPZEqnArray<TVar> REqnArray;
	out <<  "Number of entries on File  "<< fBlockPos.NElements() << endl;
	for(i=0;i<fBlockPos.NElements();i++) {
		if (fBlockPos[i]) {
			fseek(fIOStream,fBlockPos[i],SEEK_SET);
			REqnArray.Read(fIOStream);
			REqnArray.Print(name, out);
		}
	}
}